

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O1

void __thiscall
embree::InstanceArray::setBuffer
          (InstanceArray *this,RTCBufferType type,uint slot,RTCFormat format,
          Ref<embree::Buffer> *buffer,size_t offset,size_t stride,uint num)

{
  int iVar1;
  undefined8 *puVar2;
  int w;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  uint local_38;
  uint local_34;
  
  local_38 = num;
  local_34 = slot;
  iVar1 = (*(buffer->ptr->super_RefCount)._vptr_RefCount[5])();
  if ((((uint)stride | iVar1 + (int)offset) & 3) != 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"data must be 4 bytes aligned","");
    *puVar2 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar2 + 1) = 3;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_58,local_58 + local_50);
    __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  if (type == RTC_BUFFER_TYPE_INDEX) {
    if (format != RTC_FORMAT_UINT) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"invalid index buffer format. must be RTC_FORMAT_UINT.","");
      *puVar2 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar2 + 1) = 3;
      puVar2[2] = puVar2 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_58,local_58 + local_50)
      ;
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if (local_34 == 0) {
      RawBufferView::set(&(this->object_ids).super_RawBufferView,buffer,offset,stride,
                         (ulong)local_38,RTC_FORMAT_UINT);
      return;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"invalid index buffer slot. must be 0.","");
    *puVar2 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar2 + 1) = 2;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_58,local_58 + local_50);
    __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  if (type != RTC_BUFFER_TYPE_TRANSFORM) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unknown buffer type","");
    *puVar2 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar2 + 1) = 2;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_58,local_58 + local_50);
    __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  if ((int)format < 0x9244) {
    if ((format == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) || (format == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR)) {
LAB_00a35e32:
      if ((ulong)local_34 < (this->l2w_buf).size_active) {
        if (format == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          (this->super_Geometry).field_8.field_0x1 = 1;
        }
        (this->super_Geometry).numPrimitives = local_38;
        RawBufferView::set((this->l2w_buf).items + local_34,buffer,offset,stride,(ulong)local_38,
                           format);
        return;
      }
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"invalid transform buffer slot","");
      *puVar2 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar2 + 1) = 2;
      puVar2[2] = puVar2 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_58,local_58 + local_50)
      ;
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  else if ((format == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) ||
          (format == RTC_FORMAT_QUATERNION_DECOMPOSITION)) goto LAB_00a35e32;
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"invalid transform buffer format","");
  *puVar2 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar2 + 1) = 3;
  puVar2[2] = puVar2 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_58,local_58 + local_50);
  __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void InstanceArray::setBuffer(RTCBufferType type, unsigned int slot, RTCFormat format, const Ref<Buffer>& buffer, size_t offset, size_t stride, unsigned int num)
  {
    /* verify that all accesses are 4 bytes aligned */
    if (((size_t(buffer->getHostPtr()) + offset) & 0x3) || (stride & 0x3))
      throw_RTCError(RTC_ERROR_INVALID_OPERATION, "data must be 4 bytes aligned");

    if (type == RTC_BUFFER_TYPE_TRANSFORM)
    {
      if ((format != RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR)
       && (format != RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR)
       && (format != RTC_FORMAT_FLOAT3X4_ROW_MAJOR)
       && (format != RTC_FORMAT_QUATERNION_DECOMPOSITION))
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "invalid transform buffer format");

      if (slot >= l2w_buf.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid transform buffer slot");

      if (format == RTC_FORMAT_QUATERNION_DECOMPOSITION)
        gsubtype = GTY_SUBTYPE_INSTANCE_QUATERNION;
      numPrimitives = num;
      l2w_buf[slot].set(buffer, offset, stride, num, format);
      l2w_buf[slot].checkPadding16();
    }
    else if (type == RTC_BUFFER_TYPE_INDEX)
    {
      if (format != RTC_FORMAT_UINT)
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "invalid index buffer format. must be RTC_FORMAT_UINT.");

      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid index buffer slot. must be 0.");

      object_ids.set(buffer, offset, stride, num, format);
    }
    else
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
  }